

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

string * __thiscall
dtc::text_input_buffer::parse_node_or_property_name_abi_cxx11_
          (string *__return_storage_ptr__,text_input_buffer *this,bool *is_property)

{
  bool bVar1;
  text_input_buffer *ptVar2;
  char c;
  vector<char,_std::allocator<char>_> bytes;
  char local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if (*is_property == true) {
    parse_property_name_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_49 = operator*(this);
    while( true ) {
      bVar1 = anon_unknown_1::is_node_name_character::check(local_49);
      if (!bVar1) break;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&local_48,&local_49);
      ptVar2 = operator++(this);
      local_49 = operator*(ptVar2);
    }
    local_49 = operator*(this);
    while( true ) {
      bVar1 = anon_unknown_1::is_property_name_character::check(local_49);
      if (!bVar1) break;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&local_48,&local_49);
      *is_property = true;
      ptVar2 = operator++(this);
      local_49 = operator*(ptVar2);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)__return_storage_ptr__,local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string
text_input_buffer::parse_node_or_property_name(bool &is_property)
{
	if (is_property)
	{
		return parse_property_name();
	}
	std::vector<char> bytes;
	for (char c=*(*this) ; is_node_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
	}
	for (char c=*(*this) ; is_property_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
		is_property = true;
	}
	return string(bytes.begin(), bytes.end());
}